

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

int __thiscall
JsUtil::
BaseDictionary<Js::NumberTrio,_Js::NumberTrio,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::FindEntryWithKey<Js::NumberTrio>
          (BaseDictionary<Js::NumberTrio,_Js::NumberTrio,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
           *this,NumberTrio *key)

{
  Type piVar1;
  Type pSVar2;
  bool bVar3;
  hash_t hashCode_00;
  uint uVar4;
  int local_44;
  int i;
  EntryType *localEntries;
  uint targetBucket;
  hash_t hashCode;
  int *localBuckets;
  uint depth;
  NumberTrio *key_local;
  BaseDictionary<Js::NumberTrio,_Js::NumberTrio,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  localBuckets._4_4_ = 0;
  piVar1 = this->buckets;
  if (piVar1 != (Type)0x0) {
    hashCode_00 = GetHashCodeWithKey<Js::NumberTrio>(key);
    uVar4 = GetBucket(this,hashCode_00);
    pSVar2 = this->entries;
    for (local_44 = piVar1[uVar4]; -1 < local_44;
        local_44 = pSVar2[local_44].
                   super_DefaultHashedEntry<Js::NumberTrio,_Js::NumberTrio,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                   .super_ImplicitKeyValueEntry<Js::NumberTrio,_Js::NumberTrio>.
                   super_ValueEntry<Js::NumberTrio,_JsUtil::(anonymous_namespace)::ValueEntryData<Js::NumberTrio>_>
                   .super_ValueEntryData<Js::NumberTrio>.next) {
      bVar3 = DefaultHashedEntry<Js::NumberTrio,Js::NumberTrio,JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
              ::KeyEquals<DefaultComparer<Js::NumberTrio>,Js::NumberTrio>
                        ((DefaultHashedEntry<Js::NumberTrio,Js::NumberTrio,JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                          *)(pSVar2 + local_44),key,hashCode_00);
      if (bVar3) {
        if (this->stats != (Type)0x0) {
          DictionaryStats::Lookup(this->stats,localBuckets._4_4_);
        }
        return local_44;
      }
      localBuckets._4_4_ = localBuckets._4_4_ + 1;
    }
  }
  if (this->stats != (Type)0x0) {
    DictionaryStats::Lookup(this->stats,localBuckets._4_4_);
  }
  return -1;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }